

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frontend_tester.cpp
# Opt level: O1

FailStep run(string *str)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  FailStep FVar2;
  undefined1 local_80 [8];
  shared_ptr<TokenBuffer> tokenBuffer;
  shared_ptr<Parser> parser;
  shared_ptr<SemanticAnalyzer> analyzer;
  shared_ptr<StringReader> reader;
  optional<std::shared_ptr<ScriptAstNode>_> script;
  
  analyzer.super___shared_ptr<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<StringReader,std::allocator<StringReader>,std::__cxx11::string_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reader,
             (StringReader **)
             &analyzer.super___shared_ptr<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (_Sp_alloc_shared_tag<std::allocator<StringReader>_>)
             &reader.super___shared_ptr<StringReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount,str);
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012f7f8;
  __gnu_cxx::new_allocator<Tokenizer>::construct<Tokenizer,std::shared_ptr<StringReader>&>
            ((new_allocator<Tokenizer> *)
             &reader.super___shared_ptr<StringReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Tokenizer *)(this + 1),
             (shared_ptr<StringReader> *)
             &analyzer.super___shared_ptr<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  local_80 = (undefined1  [8])0x0;
  tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0x38);
  ((tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tokenList).
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)0x100000001;
  ((tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tokenList).
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&PTR___Sp_counted_ptr_inplace_0012f898;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = this->_M_use_count + 1;
  }
  local_80 = (undefined1  [8])
             &((tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              tokenList).
              super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
              _M_impl._M_node._M_size;
  ((tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tokenizer).
  super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_80;
  ((tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tokenList).
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  ._M_size = (size_t)local_80;
  ((tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tokenizer).
  super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)(this + 1);
  tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)this;
  tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Parser,std::allocator<Parser>,std::shared_ptr<TokenBuffer>&,std::ostream&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parser,
             (Parser **)
             &tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (_Sp_alloc_shared_tag<std::allocator<Parser>_>)
             &reader.super___shared_ptr<StringReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<TokenBuffer> *)local_80,
             (basic_ostream<char,_std::char_traits<char>_> *)&std::cout);
  Parser::parseScript((optional<std::shared_ptr<ScriptAstNode>_> *)
                      &reader.super___shared_ptr<StringReader,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,
                      (Parser *)
                      tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
  if (script.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._8_1_ == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failure during parsing!",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
    std::ostream::put('`');
    FVar2 = Parsing;
    std::ostream::flush();
  }
  else {
    parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<SemanticAnalyzer,std::allocator<SemanticAnalyzer>,std::ostream&,std::shared_ptr<StringReader>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&analyzer,
               (SemanticAnalyzer **)
               &parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (_Sp_alloc_shared_tag<std::allocator<SemanticAnalyzer>_>)
               &script.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload
                .super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>.field_0x17,
               (basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
               (shared_ptr<StringReader> *)
               &analyzer.super___shared_ptr<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (script.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._8_1_ == '\0') {
      std::__throw_bad_optional_access();
    }
    bVar1 = SemanticAnalyzer::isValid
                      ((SemanticAnalyzer *)
                       parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi,(shared_ptr<ScriptAstNode> *)
                             &reader.super___shared_ptr<StringReader,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No Failure!",0xb);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      FVar2 = None;
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failure during semantic analysis!",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
      std::ostream::put('`');
      FVar2 = SemanticAnalysis;
      std::ostream::flush();
    }
    if (analyzer.super___shared_ptr<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 analyzer.super___shared_ptr<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  if (script.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._8_1_ == '\x01') {
    script.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._8_1_ = 0;
    if (script.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._M_value.
        super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 script.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._M_value.
                 super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  if (parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  if (reader.super___shared_ptr<StringReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               reader.super___shared_ptr<StringReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return FVar2;
}

Assistant:

FailStep run(const std::string & str) {

  auto reader = std::make_shared<StringReader>(str);
  auto tokenizer = std::make_shared<Tokenizer>(reader);
  auto tokenBuffer = std::make_shared<TokenBuffer>(tokenizer);
  auto parser = std::make_shared<Parser>(tokenBuffer, std::cout);

  auto script = parser->parseScript();

  if (!script) {
    std::cerr << "Failure during parsing!" << std::endl;
    return FailStep::Parsing;
  }

  auto analyzer = std::make_shared<SemanticAnalyzer>(std::cout, reader);

  if (!analyzer->isValid(script.value())) {
    std::cerr << "Failure during semantic analysis!" << std::endl;
    return FailStep::SemanticAnalysis;
  }

  std::cout << "No Failure!" << std::endl;

  return FailStep::None;
}